

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxi32 SyMemBackendInitFromParent(SyMemBackend *pBackend,SyMemBackend *pParent)

{
  SyMutexMethods *pSVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  SyMutex *pSVar5;
  
  SyZero(pBackend,0xb8);
  pBackend->pMethods = pParent->pMethods;
  uVar2 = *(undefined4 *)((long)&pParent->xMemError + 4);
  uVar3 = *(undefined4 *)&pParent->pUserData;
  uVar4 = *(undefined4 *)((long)&pParent->pUserData + 4);
  *(undefined4 *)&pBackend->xMemError = *(undefined4 *)&pParent->xMemError;
  *(undefined4 *)((long)&pBackend->xMemError + 4) = uVar2;
  *(undefined4 *)&pBackend->pUserData = uVar3;
  *(undefined4 *)((long)&pBackend->pUserData + 4) = uVar4;
  pSVar1 = pParent->pMutexMethods;
  if (pSVar1 != (SyMutexMethods *)0x0) {
    pBackend->pMutexMethods = pSVar1;
    pSVar5 = (*pSVar1->xNew)(1);
    pBackend->pMutex = pSVar5;
    if (pSVar5 == (SyMutex *)0x0) {
      return -0x17;
    }
  }
  return 0;
}

Assistant:

JX9_PRIVATE sxi32 SyMemBackendInitFromParent(SyMemBackend *pBackend,const SyMemBackend *pParent)
{
	sxu8 bInheritMutex;
#if defined(UNTRUST)
	if( pBackend == 0 || SXMEM_BACKEND_CORRUPT(pParent) ){
		return SXERR_CORRUPT;
	}
#endif
	/* Zero the allocator first */
	SyZero(&(*pBackend), sizeof(SyMemBackend));
	pBackend->pMethods  = pParent->pMethods;
	pBackend->xMemError = pParent->xMemError;
	pBackend->pUserData = pParent->pUserData;
	bInheritMutex = pParent->pMutexMethods ? TRUE : FALSE;
	if( bInheritMutex ){
		pBackend->pMutexMethods = pParent->pMutexMethods;
		/* Create a private mutex */
		pBackend->pMutex = pBackend->pMutexMethods->xNew(SXMUTEX_TYPE_FAST);
		if( pBackend->pMutex ==  0){
			return SXERR_OS;
		}
	}
#if defined(UNTRUST)
	pBackend->nMagic = SXMEM_BACKEND_MAGIC;
#endif
	return SXRET_OK;
}